

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteBlif(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *local_60;
  uint local_44;
  int fUseHie;
  int fSpecial;
  int c;
  char *pLutStruct;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _fSpecial = (char *)0x0;
  bVar1 = false;
  local_44 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Sjah");
    if (iVar2 == -1) {
      if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
        fprintf((FILE *)pAbc->Out,"Empty network.\n");
        return 0;
      }
      if (argc == globalUtilOptind + 1) {
        if ((bVar1) || (_fSpecial != (char *)0x0)) {
          Io_WriteBlifSpecial(pAbc->pNtkCur,argv[globalUtilOptind],_fSpecial,local_44);
        }
        else {
          Io_Write(pAbc->pNtkCur,argv[globalUtilOptind],IO_FILE_BLIF);
        }
        return 0;
      }
      goto LAB_00339bd7;
    }
    switch(iVar2) {
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by string.\n");
        goto LAB_00339bd7;
      }
      _fSpecial = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      sVar3 = strlen(_fSpecial);
      if ((sVar3 != 2) && (sVar3 = strlen(_fSpecial), sVar3 != 3)) {
        Abc_Print(-1,
                  "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n"
                 );
LAB_00339bd7:
        fprintf((FILE *)pAbc->Err,"usage: write_blif [-S str] [-jah] <file>\n");
        fprintf((FILE *)pAbc->Err,"\t         writes the network into a BLIF file\n");
        if (_fSpecial == (char *)0x0) {
          local_60 = "not used";
        }
        else {
          local_60 = _fSpecial;
        }
        fprintf((FILE *)pAbc->Err,
                "\t-S str : string representing the LUT structure [default = %s]\n",local_60);
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        fprintf((FILE *)pAbc->Err,"\t-j     : enables special BLIF writing [default = %s]\n",pcVar4)
        ;
        pcVar4 = "no";
        if (local_44 != 0) {
          pcVar4 = "yes";
        }
        fprintf((FILE *)pAbc->Err,
                "\t-a     : enables hierarchical BLIF writing for LUT structures [default = %s]\n",
                pcVar4);
        fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
        fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write (extension .blif)\n");
        return 1;
      }
      break;
    default:
      goto LAB_00339bd7;
    case 0x61:
      local_44 = local_44 ^ 1;
      break;
    case 0x68:
      goto LAB_00339bd7;
    case 0x6a:
      bVar1 = (bool)(bVar1 ^ 1);
    }
  } while( true );
}

Assistant:

int IoCommandWriteBlif( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    char * pLutStruct = NULL;
    int c, fSpecial = 0;
    int fUseHie = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Sjah" ) ) != EOF )
    {
        switch ( c )
        {
            case 'S':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                    goto usage;
                }
                pLutStruct = argv[globalUtilOptind];
                globalUtilOptind++;
                if ( strlen(pLutStruct) != 2 && strlen(pLutStruct) != 3 ) 
                {
                    Abc_Print( -1, "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n" );
                    goto usage;
                }
                break;
            case 'j':
                fSpecial ^= 1;
                break;
            case 'a':
                fUseHie ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    if ( fSpecial || pLutStruct )
        Io_WriteBlifSpecial( pAbc->pNtkCur, pFileName, pLutStruct, fUseHie );
    else
        Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_BLIF );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_blif [-S str] [-jah] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the network into a BLIF file\n" );
    fprintf( pAbc->Err, "\t-S str : string representing the LUT structure [default = %s]\n", pLutStruct ? pLutStruct : "not used" );  
    fprintf( pAbc->Err, "\t-j     : enables special BLIF writing [default = %s]\n", fSpecial? "yes" : "no" );;
    fprintf( pAbc->Err, "\t-a     : enables hierarchical BLIF writing for LUT structures [default = %s]\n", fUseHie? "yes" : "no" );;
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .blif)\n" );
    return 1;
}